

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O0

int is_blk_skip(uint8_t *txb_skip,int plane,int blk_idx)

{
  int blk_idx_local;
  int plane_local;
  uint8_t *txb_skip_local;
  
  return (int)(uint)txb_skip[blk_idx] >> ((byte)plane & 0x1f) & 1;
}

Assistant:

static inline int is_blk_skip(uint8_t *txb_skip, int plane, int blk_idx) {
#ifndef NDEBUG
  // Check if this is initialized
  assert(!(txb_skip[blk_idx] & (1UL << (plane + 4))));

  // The magic number is 0x77, this is to test if there is garbage data
  assert((txb_skip[blk_idx] & 0x88) == 0);
#endif
  return (txb_skip[blk_idx] >> plane) & 1;
}